

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O2

void printKVDataJSON(ktx_uint8_t *pKvd,ktx_uint32_t kvdLen,ktx_uint32_t base_indent,
                    ktx_uint32_t indent_width,_Bool minified)

{
  byte bVar1;
  uint uVar2;
  _Bool _Var3;
  ktx_error_code_e kVar4;
  uint uVar5;
  int iVar6;
  ktxHashList This;
  uint8_t *puVar7;
  uint uVar8;
  uint *puVar9;
  ulong uVar10;
  uint uVar11;
  undefined7 in_register_00000081;
  char *pcVar12;
  uint8_t *__s;
  uint8_t *puVar13;
  bool bVar14;
  ktx_uint32_t valueLen;
  char *key;
  char *value;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint8_t *local_50;
  uint8_t *local_48;
  ktxHashList kvDataHead;
  ktx_uint32_t keyLen;
  
  puVar13 = " ";
  bVar14 = (int)CONCAT71(in_register_00000081,minified) != 0;
  if (bVar14) {
    puVar13 = "";
  }
  __s = "\n";
  if (bVar14) {
    __s = "";
  }
  kvDataHead = (ktxHashList)0x0;
  if ((pKvd == (ktx_uint8_t *)0x0) || (kvdLen == 0)) {
    __assert_fail("pKvd != NULL && kvdLen > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/info.c"
                  ,0xf2,
                  "void printKVDataJSON(ktx_uint8_t *, ktx_uint32_t, ktx_uint32_t, ktx_uint32_t, _Bool)"
                 );
  }
  kVar4 = ktxHashList_Deserialize(&kvDataHead,kvdLen,pKvd);
  if (kvDataHead != (ktxHashList)0x0 && kVar4 == KTX_SUCCESS) {
    uVar5 = indent_width * base_indent;
    local_54 = (base_indent + 1) * indent_width;
    bVar14 = true;
    This = kvDataHead;
    local_50 = __s;
    local_48 = puVar13;
    for (uVar8 = 0; (This != (ktxHashListEntry *)0x0 && (uVar8 < 100)); uVar8 = uVar8 + 1) {
      ktxHashListEntry_GetKey(This,&keyLen,&key);
      ktxHashListEntry_GetValue(This,&valueLen,&value);
      puVar9 = (uint *)value;
      pcVar12 = key;
      if (value == (char *)0x0) {
        _Var3 = isKnownKeyValue(key);
        if (!_Var3) {
          if (!bVar14) {
            fprintf(_stdout,",%s",__s);
            pcVar12 = key;
          }
          bVar14 = false;
          printf("%*s\"%s\":%snull",(ulong)uVar5,"",pcVar12,puVar13);
        }
      }
      else {
        iVar6 = strcmp(key,"KTXglFormat");
        if (iVar6 == 0) {
          if (valueLen == 0xc) {
            if (!bVar14) {
              fprintf(_stdout,",%s",__s);
              puVar9 = (uint *)value;
              pcVar12 = key;
            }
            puVar13 = local_48;
            uVar2 = *puVar9;
            local_5c = puVar9[1];
            local_58 = puVar9[2];
            printf("%*s\"%s\":%s{%s",(ulong)uVar5,"",pcVar12,local_48,local_50);
            __s = local_50;
            uVar11 = local_54;
            printf("%*s\"glInternalformat\":%s%u,%s",(ulong)local_54,"",puVar13,(ulong)uVar2,
                   local_50);
            printf("%*s\"glFormat\":%s%u,%s",(ulong)uVar11,"",puVar13,(ulong)local_5c,__s);
            pcVar12 = "%*s\"glType\":%s%u%s";
LAB_001ecf81:
            printf(pcVar12,(ulong)uVar11,"",puVar13,(ulong)local_58,__s);
LAB_001ecfa1:
            bVar14 = false;
            printf("%*s}",(ulong)uVar5,"");
          }
        }
        else {
          iVar6 = strcmp(pcVar12,"KTXanimData");
          if (iVar6 == 0) {
            if (valueLen == 0xc) {
              if (!bVar14) {
                fprintf(_stdout,",%s",__s);
                puVar9 = (uint *)value;
                pcVar12 = key;
              }
              puVar13 = local_48;
              uVar2 = *puVar9;
              local_5c = puVar9[1];
              local_58 = puVar9[2];
              printf("%*s\"%s\":%s{%s",(ulong)uVar5,"",pcVar12,local_48,local_50);
              __s = local_50;
              uVar11 = local_54;
              printf("%*s\"duration\":%s%u,%s",(ulong)local_54,"",puVar13,(ulong)uVar2,local_50);
              printf("%*s\"timescale\":%s%u,%s",(ulong)uVar11,"",puVar13,(ulong)local_5c,__s);
              pcVar12 = "%*s\"loopCount\":%s%u%s";
              goto LAB_001ecf81;
            }
          }
          else {
            iVar6 = strcmp(pcVar12,"KTXcubemapIncomplete");
            if (iVar6 == 0) {
              if (valueLen == 1) {
                if (!bVar14) {
                  fprintf(_stdout,",%s",__s);
                  puVar9 = (uint *)value;
                  pcVar12 = key;
                }
                bVar1 = *(byte *)puVar9;
                printf("%*s\"%s\":%s{%s",(ulong)uVar5,"",pcVar12,puVar13,__s);
                uVar2 = local_54;
                pcVar12 = "true";
                if ((bVar1 & 1) == 0) {
                  pcVar12 = "false";
                }
                printf("%*s\"positiveX\":%s%s,%s",(ulong)local_54,"",puVar13,pcVar12,__s);
                pcVar12 = "true";
                if ((bVar1 & 2) == 0) {
                  pcVar12 = "false";
                }
                printf("%*s\"negativeX\":%s%s,%s",(ulong)uVar2,"",puVar13,pcVar12,__s);
                pcVar12 = "true";
                if ((bVar1 & 4) == 0) {
                  pcVar12 = "false";
                }
                printf("%*s\"positiveY\":%s%s,%s",(ulong)uVar2,"",puVar13,pcVar12,__s);
                pcVar12 = "true";
                if ((bVar1 & 8) == 0) {
                  pcVar12 = "false";
                }
                printf("%*s\"negativeY\":%s%s,%s",(ulong)uVar2,"",puVar13,pcVar12,__s);
                pcVar12 = "true";
                if ((bVar1 & 0x10) == 0) {
                  pcVar12 = "false";
                }
                printf("%*s\"positiveZ\":%s%s,%s",(ulong)uVar2,"",puVar13,pcVar12,__s);
                pcVar12 = "true";
                if ((bVar1 & 0x20) == 0) {
                  pcVar12 = "false";
                }
                printf("%*s\"negativeZ\":%s%s%s",(ulong)uVar2,"",puVar13,pcVar12,__s);
                goto LAB_001ecfa1;
              }
            }
            else {
              _Var3 = isKnownKeyValueUINT32(pcVar12);
              if (_Var3) {
                if (valueLen == 4) {
                  if (!bVar14) {
                    fprintf(_stdout,",%s",__s);
                    puVar9 = (uint *)value;
                    pcVar12 = key;
                  }
                  bVar14 = false;
                  printf("%*s\"%s\":%s%u",(ulong)uVar5,"",pcVar12,puVar13,(ulong)*puVar9);
                }
              }
              else {
                _Var3 = isKnownKeyValueString(pcVar12);
                if (_Var3) {
                  if (*(char *)((long)puVar9 + (ulong)(valueLen - 1)) == '\0') {
                    if (!bVar14) {
                      fprintf(_stdout,",%s",__s);
                      puVar9 = (uint *)value;
                      pcVar12 = key;
                    }
                    bVar14 = false;
                    printf("%*s\"%s\":%s\"%s\"",(ulong)uVar5,"",pcVar12,puVar13,puVar9);
                  }
                }
                else {
                  if (!bVar14) {
                    fprintf(_stdout,",%s",__s);
                    pcVar12 = key;
                  }
                  printf("%*s\"%s\":%s[",(ulong)uVar5,"",pcVar12,puVar13);
                  uVar10 = 0;
                  while (uVar10 < valueLen) {
                    pcVar12 = value + uVar10;
                    uVar10 = uVar10 + 1;
                    puVar7 = ", ";
                    if (uVar10 == valueLen) {
                      puVar7 = "";
                    }
                    fprintf(_stdout,"%d%s",(ulong)(uint)(int)*pcVar12,puVar7);
                  }
                  fputc(0x5d,_stdout);
                  bVar14 = false;
                }
              }
            }
          }
        }
      }
      This = ktxHashList_Next(This);
    }
    fputs((char *)__s,_stdout);
    ktxHashList_Destruct(&kvDataHead);
  }
  return;
}

Assistant:

void
printKVDataJSON(ktx_uint8_t* pKvd, ktx_uint32_t kvdLen, ktx_uint32_t base_indent, ktx_uint32_t indent_width, bool minified)
{
    const char* space = minified ? "" : " ";
    const char* nl = minified ? "" : "\n";

    KTX_error_code result;
    ktxHashList kvDataHead = 0;

    assert(pKvd != NULL && kvdLen > 0);

    result = ktxHashList_Deserialize(&kvDataHead, kvdLen, pKvd);
    if (result != KTX_SUCCESS) {
        // Logging while printing JSON is not possible, we rely on the validation step to provide meaningful errors
        // fprintf(stdout, "Failed to parse or not enough memory to build list of key/value pairs.\n");
        return;
    }

    if (kvDataHead == NULL)
        return;

    int entryIndex = 0;
    ktxHashListEntry* entry = kvDataHead;
    bool firstPrint = true; // Marks if the first print did not occur yet (first print != first entry)
    for (; entry != NULL && entryIndex < MAX_NUM_KVD_ENTRIES; entry = ktxHashList_Next(entry), ++entryIndex) {
        char* key;
        char* value;
        ktx_uint32_t keyLen, valueLen;

        ktxHashListEntry_GetKey(entry, &keyLen, &key);
        ktxHashListEntry_GetValue(entry, &valueLen, (void**)&value);
        // Keys must be NUL terminated.
        if (!value) {
            if (!isKnownKeyValue(key)) {
                // Known keys are not be printed with null
                if (!firstPrint)
                    fprintf(stdout, ",%s", nl);
                firstPrint = false;
                PRINT_INDENT(0, "\"%s\":%snull", key, space)
            }
        } else {
            if (strcmp(key, "KTXglFormat") == 0) {
                if (valueLen == 3 * sizeof(ktx_uint32_t)) {
                    if (!firstPrint)
                        fprintf(stdout, ",%s", nl);
                    firstPrint = false;
                    ktx_uint32_t glInternalformat = *(const ktx_uint32_t*) (value + 0);
                    ktx_uint32_t glFormat = *(const ktx_uint32_t*) (value + 4);
                    ktx_uint32_t glType = *(const ktx_uint32_t*) (value + 8);
                    PRINT_INDENT(0, "\"%s\":%s{%s", key, space, nl)
                    PRINT_INDENT(1, "\"glInternalformat\":%s%u,%s", space, glInternalformat, nl)
                    PRINT_INDENT(1, "\"glFormat\":%s%u,%s", space, glFormat, nl)
                    PRINT_INDENT(1, "\"glType\":%s%u%s", space, glType, nl)
                    PRINT_INDENT_NOARG(0, "}")
                }
            } else if (strcmp(key, "KTXanimData") == 0) {
                if (valueLen == 3 * sizeof(ktx_uint32_t)) {
                    if (!firstPrint)
                        fprintf(stdout, ",%s", nl);
                    firstPrint = false;
                    ktx_uint32_t duration = *(const ktx_uint32_t*) (value + 0);
                    ktx_uint32_t timescale = *(const ktx_uint32_t*) (value + 4);
                    ktx_uint32_t loopCount = *(const ktx_uint32_t*) (value + 8);
                    PRINT_INDENT(0, "\"%s\":%s{%s", key, space, nl)
                    PRINT_INDENT(1, "\"duration\":%s%u,%s", space, duration, nl)
                    PRINT_INDENT(1, "\"timescale\":%s%u,%s", space, timescale, nl)
                    PRINT_INDENT(1, "\"loopCount\":%s%u%s", space, loopCount, nl)
                    PRINT_INDENT_NOARG(0, "}")
                }
            } else if (strcmp(key, "KTXcubemapIncomplete") == 0) {
                if (valueLen == sizeof(ktx_uint8_t)) {
                    if (!firstPrint)
                        fprintf(stdout, ",%s", nl);
                    firstPrint = false;
                    ktx_uint8_t faces = *value;
                    PRINT_INDENT(0, "\"%s\":%s{%s", key, space, nl)
                    PRINT_INDENT(1, "\"positiveX\":%s%s,%s", space, faces & 1u << 0u ? "true" : "false", nl)
                    PRINT_INDENT(1, "\"negativeX\":%s%s,%s", space, faces & 1u << 1u ? "true" : "false", nl)
                    PRINT_INDENT(1, "\"positiveY\":%s%s,%s", space, faces & 1u << 2u ? "true" : "false", nl)
                    PRINT_INDENT(1, "\"negativeY\":%s%s,%s", space, faces & 1u << 3u ? "true" : "false", nl)
                    PRINT_INDENT(1, "\"positiveZ\":%s%s,%s", space, faces & 1u << 4u ? "true" : "false", nl)
                    PRINT_INDENT(1, "\"negativeZ\":%s%s%s", space, faces & 1u << 5u ? "true" : "false", nl)
                    PRINT_INDENT_NOARG(0, "}")
                }
            } else if (isKnownKeyValueUINT32(key)) {
                if (valueLen == sizeof(ktx_uint32_t)) {
                    if (!firstPrint)
                        fprintf(stdout, ",%s", nl);
                    firstPrint = false;
                    ktx_uint32_t number = *(const ktx_uint32_t*) value;
                    PRINT_INDENT(0, "\"%s\":%s%u", key, space, number)
                }
            } else if (isKnownKeyValueString(key)) {
                if (value[valueLen-1] == '\0') {
                    if (!firstPrint)
                        fprintf(stdout, ",%s", nl);
                    firstPrint = false;
                    PRINT_INDENT(0, "\"%s\":%s\"%s\"", key, space, value)
                }
            } else {
                if (!firstPrint)
                    fprintf(stdout, ",%s", nl);
                firstPrint = false;
                PRINT_INDENT(0, "\"%s\":%s[", key, space)
                for (ktx_uint32_t i = 0; i < valueLen; i++)
                    fprintf(stdout, "%d%s", (int) value[i], i + 1 == valueLen ? "" : ", ");
                fprintf(stdout, "]");
            }
        }
    }
    fprintf(stdout, "%s", nl);

    ktxHashList_Destruct(&kvDataHead);
}